

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

uint32_t msr_mask(DisasContext_conflict1 *s,int flags,int spsr)

{
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  
  uVar2 = -(flags & 1U) & 0xff;
  uVar3 = uVar2 + 0xff00;
  if ((flags & 2U) == 0) {
    uVar3 = uVar2;
  }
  uVar2 = uVar3 + 0xff0000;
  if ((flags & 4U) == 0) {
    uVar2 = uVar3;
  }
  uVar3 = uVar2 - 0x1000000;
  if ((flags & 8U) == 0) {
    uVar3 = uVar2;
  }
  uVar1 = s->features;
  uVar2 = 0xf01f03df;
  if ((uVar1 & 8) == 0) {
    uVar2 = 0xf01001df;
  }
  uVar2 = uVar2 | ((uint)uVar1 & 0x8000) << 0xc | (uint)((uVar1 & 0xffff) >> 9);
  uVar4 = uVar2 + 0x600fc00;
  if ((uVar1 & 0x40) == 0) {
    uVar4 = uVar2;
  }
  uVar2 = uVar4 + 0x1000000;
  if (s->isar->id_isar1 < 0x10000000) {
    uVar2 = uVar4;
  }
  uVar4 = uVar2 | 0x400000;
  if ((s->isar->id_mmfr3 & 0xf0000) == 0) {
    uVar4 = uVar2;
  }
  uVar2 = uVar4 & uVar3 & 0xf8ef03df;
  if (spsr != 0) {
    uVar2 = uVar4 & uVar3;
  }
  uVar3 = uVar2 & 0xf80f0000;
  if (s->user == 0) {
    uVar3 = uVar2;
  }
  return uVar3;
}

Assistant:

static uint32_t msr_mask(DisasContext *s, int flags, int spsr)
{
    uint32_t mask = 0;

    if (flags & (1 << 0)) {
        mask |= 0xff;
    }
    if (flags & (1 << 1)) {
        mask |= 0xff00;
    }
    if (flags & (1 << 2)) {
        mask |= 0xff0000;
    }
    if (flags & (1 << 3)) {
        mask |= 0xff000000;
    }

    /* Mask out undefined and reserved bits.  */
    mask &= aarch32_cpsr_valid_mask(s->features, s->isar);

    /* Mask out execution state.  */
    if (!spsr) {
        mask &= ~CPSR_EXEC;
    }

    /* Mask out privileged bits.  */
    if (IS_USER(s)) {
        mask &= CPSR_USER;
    }
    return mask;
}